

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void * __thiscall
pugi::impl::anon_unknown_0::xml_allocator::allocate_memory_oob
          (xml_allocator *this,size_t size,xml_memory_page **out_page)

{
  xml_memory_page *pxVar1;
  xml_memory_page *pxVar2;
  xml_memory_page *pxVar3;
  size_t *psVar4;
  long lVar5;
  
  lVar5 = 0x8000;
  if (0x1ff6 < size) {
    lVar5 = size + 0x28;
  }
  pxVar3 = (xml_memory_page *)
           (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::allocate)
                     (lVar5);
  if (pxVar3 == (xml_memory_page *)0x0) {
    *out_page = (xml_memory_page *)0x0;
    pxVar3 = (xml_memory_page *)0x0;
  }
  else {
    pxVar3->busy_size = 0;
    pxVar3->freed_size = 0;
    pxVar3->prev = (xml_memory_page *)0x0;
    pxVar3->next = (xml_memory_page *)0x0;
    pxVar3->allocator = this;
    *out_page = pxVar3;
    if (size < 0x1ff7) {
      psVar4 = &this->_busy_size;
      pxVar1 = this->_root;
      pxVar1->busy_size = this->_busy_size;
      pxVar3->prev = pxVar1;
      pxVar1->next = pxVar3;
      this->_root = pxVar3;
    }
    else {
      pxVar1 = this->_root;
      pxVar2 = pxVar1->prev;
      pxVar3->prev = pxVar2;
      pxVar3->next = pxVar1;
      pxVar2->next = pxVar3;
      pxVar1->prev = pxVar3;
      psVar4 = &pxVar3->busy_size;
    }
    *psVar4 = size;
    pxVar3 = pxVar3 + 1;
  }
  return pxVar3;
}

Assistant:

PUGI_IMPL_FN_NO_INLINE void* xml_allocator::allocate_memory_oob(size_t size, xml_memory_page*& out_page)
	{
		const size_t large_allocation_threshold = xml_memory_page_size / 4;

		xml_memory_page* page = allocate_page(size <= large_allocation_threshold ? xml_memory_page_size : size);
		out_page = page;

		if (!page) return NULL;

		if (size <= large_allocation_threshold)
		{
			_root->busy_size = _busy_size;

			// insert page at the end of linked list
			page->prev = _root;
			_root->next = page;
			_root = page;

			_busy_size = size;
		}
		else
		{
			// insert page before the end of linked list, so that it is deleted as soon as possible
			// the last page is not deleted even if it's empty (see deallocate_memory)
			assert(_root->prev);

			page->prev = _root->prev;
			page->next = _root;

			_root->prev->next = page;
			_root->prev = page;

			page->busy_size = size;
		}

		return reinterpret_cast<char*>(page) + sizeof(xml_memory_page);
	}